

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_div(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 source1,TCGv_i64 source2)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i64 c2;
  TCGTemp *ts_01;
  uintptr_t o;
  TCGv_i64 ret_00;
  
  ts = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)ts_00 - (long)tcg_ctx);
  c2 = tcg_const_i64_riscv64(tcg_ctx,0);
  ts_01 = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)ts_01,0xffffffffffffffff);
  tcg_gen_setcondi_i64_riscv64(tcg_ctx,TCG_COND_EQ,ret_00,source2,-1);
  tcg_gen_setcondi_i64_riscv64
            (tcg_ctx,TCG_COND_EQ,(TCGv_i64)((long)ts - (long)tcg_ctx),source1,-0x8000000000000000);
  tcg_gen_op3_riscv64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)ts_00);
  tcg_gen_setcondi_i64_riscv64(tcg_ctx,TCG_COND_EQ,ret_00,source2,0);
  tcg_gen_movcond_i64_riscv64
            (tcg_ctx,TCG_COND_EQ,source1,ret_00,c2,source1,(TCGv_i64)((long)ts_01 - (long)tcg_ctx));
  tcg_gen_op3_riscv64(tcg_ctx,INDEX_op_or_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)ts_00);
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)ts_01,1);
  tcg_gen_movcond_i64_riscv64
            (tcg_ctx,TCG_COND_EQ,source2,(TCGv_i64)((long)ts - (long)tcg_ctx),c2,source2,
             (TCGv_i64)((long)ts_01 - (long)tcg_ctx));
  tcg_gen_div_i64_riscv64(tcg_ctx,ret,source1,source2);
  tcg_temp_free_internal_riscv64(tcg_ctx,ts);
  tcg_temp_free_internal_riscv64(tcg_ctx,ts_00);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,ts_01);
  return;
}

Assistant:

static void gen_div(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_div(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                   cpu_gpr[rB(ctx->opcode)]);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}